

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cc
# Opt level: O0

void __thiscall fasttext::Matrix::load(Matrix *this,istream *in)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  void *pvVar3;
  char *in_RSI;
  long *in_RDI;
  
  std::istream::read(in_RSI,(long)(in_RDI + 1));
  std::istream::read(in_RSI,(long)(in_RDI + 2));
  if ((void *)*in_RDI != (void *)0x0) {
    operator_delete__((void *)*in_RDI);
  }
  auVar1._8_8_ = 0;
  auVar1._0_8_ = in_RDI[1] * in_RDI[2];
  uVar2 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  pvVar3 = operator_new__(uVar2);
  *in_RDI = (long)pvVar3;
  std::istream::read(in_RSI,*in_RDI);
  return;
}

Assistant:

void Matrix::load(std::istream& in) {
  in.read((char*) &m_, sizeof(int64_t));
  in.read((char*) &n_, sizeof(int64_t));
  delete[] data_;
  data_ = new real[m_ * n_];
  in.read((char*) data_, m_ * n_ * sizeof(real));
}